

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

roaring_bitmap_t * roaring_bitmap_xor(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  int start_index;
  int start_index_00;
  int end_index;
  int end_index_00;
  roaring_array_t *sa;
  roaring_bitmap_t *sa_00;
  _Bool _Var1;
  roaring_array_t *prVar2;
  container_t *pcVar3;
  container_t *c2_00;
  _Bool local_71;
  container_t *c2_1;
  container_t *c1_1;
  container_t *c;
  container_t *c2;
  container_t *c1;
  int iStack_40;
  uint16_t s2;
  uint16_t s1;
  uint8_t type2;
  uint8_t type1;
  int pos2;
  int pos1;
  roaring_bitmap_t *answer;
  int local_28;
  int length2;
  int length1;
  uint8_t result_type;
  roaring_bitmap_t *x2_local;
  roaring_bitmap_t *x1_local;
  
  length2._3_1_ = '\0';
  local_28 = (x1->high_low_container).size;
  answer._4_4_ = (x2->high_low_container).size;
  _length1 = &x2->high_low_container;
  x2_local = x1;
  if (local_28 == 0) {
    x1_local = roaring_bitmap_copy(x2);
  }
  else if (answer._4_4_ == 0) {
    x1_local = roaring_bitmap_copy(x1);
  }
  else {
    prVar2 = &roaring_bitmap_create_with_capacity(local_28 + answer._4_4_)->high_low_container;
    _pos2 = prVar2;
    _Var1 = is_cow(x2_local);
    local_71 = false;
    if (_Var1) {
      local_71 = is_cow((roaring_bitmap_t *)_length1);
    }
    roaring_bitmap_set_copy_on_write((roaring_bitmap_t *)prVar2,local_71);
    _s1 = 0;
    iStack_40 = 0;
    c1._4_2_ = ra_get_key_at_index(&x2_local->high_low_container,0);
    c1._2_2_ = ra_get_key_at_index(_length1,(uint16_t)iStack_40);
    while( true ) {
      while (c1._4_2_ != c1._2_2_) {
        if (c1._4_2_ < c1._2_2_) {
          pcVar3 = ra_get_container_at_index
                             (&x2_local->high_low_container,(uint16_t)_s1,(uint8_t *)((long)&c1 + 7)
                             );
          _Var1 = is_cow(x2_local);
          pcVar3 = get_copy_of_container(pcVar3,(uint8_t *)((long)&c1 + 7),_Var1);
          _Var1 = is_cow(x2_local);
          if (_Var1) {
            ra_set_container_at_index(&x2_local->high_low_container,_s1,pcVar3,c1._7_1_);
          }
          ra_append(_pos2,c1._4_2_,pcVar3,c1._7_1_);
          _s1 = _s1 + 1;
          if (_s1 == local_28) goto LAB_00144a6e;
          c1._4_2_ = ra_get_key_at_index(&x2_local->high_low_container,(uint16_t)_s1);
        }
        else {
          pcVar3 = ra_get_container_at_index
                             (_length1,(uint16_t)iStack_40,(uint8_t *)((long)&c1 + 6));
          _Var1 = is_cow((roaring_bitmap_t *)_length1);
          pcVar3 = get_copy_of_container(pcVar3,(uint8_t *)((long)&c1 + 6),_Var1);
          _Var1 = is_cow((roaring_bitmap_t *)_length1);
          if (_Var1) {
            ra_set_container_at_index(_length1,iStack_40,pcVar3,c1._6_1_);
          }
          ra_append(_pos2,c1._2_2_,pcVar3,c1._6_1_);
          iStack_40 = iStack_40 + 1;
          if (iStack_40 == answer._4_4_) goto LAB_00144a6e;
          c1._2_2_ = ra_get_key_at_index(_length1,(uint16_t)iStack_40);
        }
      }
      pcVar3 = ra_get_container_at_index
                         (&x2_local->high_low_container,(uint16_t)_s1,(uint8_t *)((long)&c1 + 7));
      c2_00 = ra_get_container_at_index(_length1,(uint16_t)iStack_40,(uint8_t *)((long)&c1 + 6));
      pcVar3 = container_xor(pcVar3,c1._7_1_,c2_00,c1._6_1_,(uint8_t *)((long)&length2 + 3));
      _Var1 = container_nonzero_cardinality(pcVar3,length2._3_1_);
      if (_Var1) {
        ra_append(_pos2,c1._4_2_,pcVar3,length2._3_1_);
      }
      else {
        container_free(pcVar3,length2._3_1_);
      }
      _s1 = _s1 + 1;
      iStack_40 = iStack_40 + 1;
      if ((_s1 == local_28) || (iStack_40 == answer._4_4_)) break;
      c1._4_2_ = ra_get_key_at_index(&x2_local->high_low_container,(uint16_t)_s1);
      c1._2_2_ = ra_get_key_at_index(_length1,(uint16_t)iStack_40);
    }
LAB_00144a6e:
    sa_00 = x2_local;
    sa = _length1;
    end_index_00 = local_28;
    end_index = answer._4_4_;
    prVar2 = _pos2;
    start_index_00 = _s1;
    start_index = iStack_40;
    if (_s1 == local_28) {
      _Var1 = is_cow((roaring_bitmap_t *)_length1);
      ra_append_copy_range(prVar2,sa,start_index,end_index,_Var1);
    }
    else if (iStack_40 == answer._4_4_) {
      _Var1 = is_cow(x2_local);
      ra_append_copy_range(prVar2,&sa_00->high_low_container,start_index_00,end_index_00,_Var1);
    }
    x1_local = (roaring_bitmap_t *)_pos2;
  }
  return x1_local;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_xor(const roaring_bitmap_t *x1,
                                     const roaring_bitmap_t *x2) {
    uint8_t result_type = 0;
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    if (0 == length1) {
        return roaring_bitmap_copy(x2);
    }
    if (0 == length2) {
        return roaring_bitmap_copy(x1);
    }
    roaring_bitmap_t *answer =
        roaring_bitmap_create_with_capacity(length1 + length2);
    roaring_bitmap_set_copy_on_write(answer, is_cow(x1) && is_cow(x2));
    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);
            container_t *c = container_xor(c1, type1, c2, type2, &result_type);

            if (container_nonzero_cardinality(c, result_type)) {
                ra_append(&answer->high_low_container, s1, c, result_type);
            } else {
                container_free(c, result_type);
            }
            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);

        } else if (s1 < s2) {  // s1 < s2
            container_t *c1 = ra_get_container_at_index(
                                &x1->high_low_container, pos1, &type1);
            c1 = get_copy_of_container(c1, &type1, is_cow(x1));
            if (is_cow(x1)) {
                ra_set_container_at_index(&x1->high_low_container, pos1, c1,
                                          type1);
            }
            ra_append(&answer->high_low_container, s1, c1, type1);
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(
                                &x2->high_low_container, pos2, &type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }
            ra_append(&answer->high_low_container, s2, c2, type2);
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&answer->high_low_container,
                             &x2->high_low_container, pos2, length2,
                             is_cow(x2));
    } else if (pos2 == length2) {
        ra_append_copy_range(&answer->high_low_container,
                             &x1->high_low_container, pos1, length1,
                             is_cow(x1));
    }
    return answer;
}